

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O1

void __thiscall
fasttext::FastText::skipgram
          (FastText *this,State *state,real lr,vector<int,_std::allocator<int>_> *line)

{
  int factor;
  result_type_conflict1 rVar1;
  vector<int,_std::allocator<int>_> *__x;
  uint targetIndex;
  int iVar2;
  ulong uVar3;
  uniform_int_distribution<int> uniform;
  vector<int,_std::allocator<int>_> ngramsmod;
  uniform_int_distribution<int> local_58;
  vector<int,_std::allocator<int>_> local_50;
  minstd_rand *local_38;
  
  local_58._M_param._M_b =
       ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->ws;
  local_58._M_param._M_a = 1;
  if ((line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish !=
      (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
     ) {
    local_38 = &state->rng;
    uVar3 = 0;
    do {
      rVar1 = std::uniform_int_distribution<int>::operator()(&local_58,local_38,&local_58._M_param);
      __x = Dictionary::getSubwords
                      ((this->dict_).
                       super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                       (line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start[uVar3]);
      std::vector<int,_std::allocator<int>_>::vector(&local_50,__x);
      factor = ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->factor;
      iVar2 = factor;
      if (0 < factor &&
          local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish !=
          local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start) {
        do {
          std::vector<int,_std::allocator<int>_>::insert
                    (&local_50,
                     (const_iterator)
                     local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish,
                     local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start);
          iVar2 = iVar2 + -1;
        } while (iVar2 != 0);
      }
      if (-1 < rVar1) {
        iVar2 = 0;
        do {
          if (((rVar1 != iVar2) &&
              (targetIndex = ((int)uVar3 - rVar1) + iVar2, -1 < (int)targetIndex)) &&
             ((ulong)targetIndex <
              (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_start >> 2))) {
            Model::update((this->model_).
                          super___shared_ptr<fasttext::Model,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          &local_50,line,targetIndex,lr,state,factor);
          }
          iVar2 = iVar2 + 1;
        } while (rVar1 * 2 + 1 != iVar2);
      }
      if (local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start != (value_type_conflict1 *)0x0) {
        operator_delete(local_50.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 < (ulong)((long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(line->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  return;
}

Assistant:

void FastText::skipgram(
    Model::State& state,
    real lr,
    const std::vector<int32_t>& line) {
  std::uniform_int_distribution<> uniform(1, args_->ws);
  for (int32_t w = 0; w < line.size(); w++) {
    int32_t boundary = uniform(state.rng);
    const std::vector<int32_t>& ngrams = dict_->getSubwords(line[w]);
    std::vector<int32_t> ngramsmod = ngrams;
    int factor = args_->factor;
    if (ngramsmod.size() > 0) {
        for (int i=0; i<factor; i++) ngramsmod.insert(ngramsmod.end(),ngramsmod[0]); //mod avg-pool to weighted-avg-pool
    }
    for (int32_t c = -boundary; c <= boundary; c++) {
      if (c != 0 && w + c >= 0 && w + c < line.size()) {
          model_->update(ngramsmod, line, w + c, lr, state, factor);
      }
    }
  }
}